

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O1

ArrayPtr<capnp::word> __thiscall
capnp::MallocMessageBuilder::allocateSegment(MallocMessageBuilder *this,uint minimumSize)

{
  RemoveConst<void_*> **pppvVar1;
  bool bVar2;
  uint uVar3;
  void **ppvVar4;
  void **ppvVar5;
  void *pvVar6;
  size_t newSize;
  size_t __nmemb;
  ArrayPtr<capnp::word> AVar7;
  uint size;
  Fault f;
  uint local_2c;
  Fault local_28;
  
  if (0x1fffffff < minimumSize) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0xed,FAILED,"bounded(minimumSize) * WORDS <= MAX_SEGMENT_WORDS",
               "\"MallocMessageBuilder asked to allocate segment above maximum serializable size.\""
               ,(char (*) [80])
                "MallocMessageBuilder asked to allocate segment above maximum serializable size.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  local_2c = *(uint *)&(this->super_MessageBuilder).field_0xbc;
  if (0x1fffffff < local_2c) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0xef,FAILED,"bounded(nextSize) * WORDS <= MAX_SEGMENT_WORDS",
               "\"MallocMessageBuilder nextSize out of bounds.\"",
               (char (*) [45])"MallocMessageBuilder nextSize out of bounds.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  bVar2 = this->returnedFirstSegment;
  if ((bVar2 == false) && (this->ownFirstSegment == false)) {
    if (minimumSize <= local_2c) {
      pvVar6 = this->firstSegment;
      this->returnedFirstSegment = true;
      goto LAB_0028935c;
    }
    this->ownFirstSegment = true;
  }
  __nmemb = (size_t)local_2c;
  if (local_2c < minimumSize) {
    __nmemb = (size_t)minimumSize;
  }
  local_2c = (uint)__nmemb;
  pvVar6 = calloc(__nmemb,8);
  if (pvVar6 == (void *)0x0) {
    kj::_::Debug::Fault::Fault<int,unsigned_int&>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0x101,0xc,"calloc(size, sizeof(word))","size",&local_2c);
    kj::_::Debug::Fault::fatal(&local_28);
  }
  if (bVar2 == false) {
    this->firstSegment = pvVar6;
    this->returnedFirstSegment = true;
    if (this->allocationStrategy != GROW_HEURISTICALLY) goto LAB_0028935c;
  }
  else {
    ppvVar4 = (this->moreSegments).builder.endPtr;
    if ((this->moreSegments).builder.pos == ppvVar4) {
      ppvVar5 = (this->moreSegments).builder.ptr;
      newSize = 4;
      if (ppvVar4 != ppvVar5) {
        newSize = (long)ppvVar4 - (long)ppvVar5 >> 2;
      }
      kj::Vector<void_*>::setCapacity(&this->moreSegments,newSize);
    }
    *(this->moreSegments).builder.pos = pvVar6;
    pppvVar1 = &(this->moreSegments).builder.pos;
    *pppvVar1 = *pppvVar1 + 1;
    if (this->allocationStrategy != GROW_HEURISTICALLY) goto LAB_0028935c;
    uVar3 = *(uint *)&(this->super_MessageBuilder).field_0xbc;
    __nmemb = 0x1fffffff;
    if ((ulong)local_2c <= 0x1fffffff - (ulong)uVar3) {
      __nmemb = (size_t)(uVar3 + local_2c);
    }
  }
  *(int *)&(this->super_MessageBuilder).field_0xbc = (int)__nmemb;
LAB_0028935c:
  AVar7.size_._0_4_ = local_2c;
  AVar7.ptr = (word *)pvVar6;
  AVar7.size_._4_4_ = 0;
  return AVar7;
}

Assistant:

kj::ArrayPtr<word> MallocMessageBuilder::allocateSegment(uint minimumSize) {
  KJ_REQUIRE(bounded(minimumSize) * WORDS <= MAX_SEGMENT_WORDS,
      "MallocMessageBuilder asked to allocate segment above maximum serializable size.");
  KJ_ASSERT(bounded(nextSize) * WORDS <= MAX_SEGMENT_WORDS,
      "MallocMessageBuilder nextSize out of bounds.");

  if (!returnedFirstSegment && !ownFirstSegment) {
    kj::ArrayPtr<word> result = kj::arrayPtr(reinterpret_cast<word*>(firstSegment), nextSize);
    if (result.size() >= minimumSize) {
      returnedFirstSegment = true;
      return result;
    }
    // If the provided first segment wasn't big enough, we discard it and proceed to allocate
    // our own.  This never happens in practice since minimumSize is always 1 for the first
    // segment.
    ownFirstSegment = true;
  }

  uint size = kj::max(minimumSize, nextSize);

  void* result = calloc(size, sizeof(word));
  if (result == nullptr) {
    KJ_FAIL_SYSCALL("calloc(size, sizeof(word))", ENOMEM, size);
  }

  if (!returnedFirstSegment) {
    firstSegment = result;
    returnedFirstSegment = true;

    // After the first segment, we want nextSize to equal the total size allocated so far.
    if (allocationStrategy == AllocationStrategy::GROW_HEURISTICALLY) nextSize = size;
  } else {
    moreSegments.add(result);
    if (allocationStrategy == AllocationStrategy::GROW_HEURISTICALLY) {
      // set nextSize = min(nextSize+size, MAX_SEGMENT_WORDS)
      // while protecting against possible overflow of (nextSize+size)
      nextSize = (size <= unbound(MAX_SEGMENT_WORDS / WORDS) - nextSize)
          ? nextSize + size : unbound(MAX_SEGMENT_WORDS / WORDS);
    }
  }

  return kj::arrayPtr(reinterpret_cast<word*>(result), size);
}